

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawAuthorMarkers(void)

{
  byte bVar1;
  FTextureID texnum;
  AActor *pAVar2;
  FTexture *tex;
  ulong uVar3;
  AActor *pAVar4;
  uint uVar5;
  ushort uVar6;
  FActorIterator it_1;
  TThinkerIterator<AActor> it;
  
  TThinkerIterator<AActor>::TThinkerIterator
            ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,"MapMarker",0x29);
LAB_00367038:
  do {
    pAVar2 = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
    if (pAVar2 == (AActor *)0x0) {
      return;
    }
  } while (((pAVar2->flags2).Value & 0x10000000) != 0);
  texnum.texnum = (pAVar2->picnum).texnum;
  if (texnum.texnum < 1) goto LAB_003670a9;
  uVar6 = 0;
  tex = FTextureManager::operator()(&TexMan,texnum,false);
  uVar3 = (ulong)tex->Rotations;
  if (uVar3 != 0xffff) {
    uVar5 = SpriteFrames.Array[uVar3].Texture[0].texnum;
    uVar6 = SpriteFrames.Array[uVar3].Flip & 1;
    if (TexMan.Textures.Count <= uVar5) goto LAB_0036710d;
    goto LAB_003670fd;
  }
  goto LAB_00367110;
LAB_003670a9:
  bVar1 = pAVar2->frame;
  if (bVar1 < sprites.Array[pAVar2->sprite].numframes) {
    uVar5 = SpriteFrames.Array[(ulong)sprites.Array[pAVar2->sprite].spriteframes + (ulong)bVar1].
            Texture[0].texnum;
    uVar6 = SpriteFrames.Array[(ulong)sprites.Array[pAVar2->sprite].spriteframes + (ulong)bVar1].
            Flip & 1;
    if (uVar5 < TexMan.Textures.Count) {
LAB_003670fd:
      tex = TexMan.Textures.Array[(int)uVar5].Texture;
    }
    else {
LAB_0036710d:
      tex = (FTexture *)0x0;
    }
LAB_00367110:
    it_1.id = pAVar2->args[0];
    it_1.base = (AActor *)0x0;
    pAVar4 = pAVar2;
    if (it_1.id != 0) {
      pAVar4 = FActorIterator::Next(&it_1);
    }
    while (pAVar4 != (AActor *)0x0) {
      if (pAVar2->args[1] == 0) {
LAB_0036717a:
        DrawMarker(tex,(pAVar4->__Pos).X,(pAVar4->__Pos).Y,0,(uint)uVar6,(pAVar2->Scale).X,
                   (pAVar2->Scale).Y,pAVar2->Translation,pAVar2->Alpha,pAVar2->fillcolor,
                   pAVar2->RenderStyle);
      }
      else if (pAVar2->args[1] == 1) {
        if (hasglnodes == true) {
          uVar5 = pAVar4->subsector->flags & 2;
        }
        else {
          uVar5 = pAVar4->Sector->MoreFlags & 0x80;
        }
        if (uVar5 != 0) goto LAB_0036717a;
      }
      pAVar4 = (AActor *)0x0;
      if (pAVar2->args[0] != 0) {
        pAVar4 = FActorIterator::Next(&it_1);
      }
    }
  }
  goto LAB_00367038;
}

Assistant:

void AM_drawAuthorMarkers ()
{
	// [RH] Draw any actors derived from AMapMarker on the automap.
	// If args[0] is 0, then the actor's sprite is drawn at its own location.
	// Otherwise, its sprite is drawn at the location of any actors whose TIDs match args[0].
	TThinkerIterator<AActor> it ("MapMarker", STAT_MAPMARKER);
	AActor *mark;

	while ((mark = it.Next()) != NULL)
	{
		if (mark->flags2 & MF2_DORMANT)
		{
			continue;
		}

		FTextureID picnum;
		FTexture *tex;
		WORD flip = 0;

		if (mark->picnum.isValid())
		{
			tex = TexMan(mark->picnum);
			if (tex->Rotations != 0xFFFF)
			{
				spriteframe_t *sprframe = &SpriteFrames[tex->Rotations];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		else
		{
			spritedef_t *sprdef = &sprites[mark->sprite];
			if (mark->frame >= sprdef->numframes)
			{
				continue;
			}
			else
			{
				spriteframe_t *sprframe = &SpriteFrames[sprdef->spriteframes + mark->frame];
				picnum = sprframe->Texture[0];
				flip = sprframe->Flip & 1;
				tex = TexMan[picnum];
			}
		}
		FActorIterator it (mark->args[0]);
		AActor *marked = mark->args[0] == 0 ? mark : it.Next();

		while (marked != NULL)
		{
			// Use more correct info if we have GL nodes available
			if (mark->args[1] == 0 ||
				(mark->args[1] == 1 && (hasglnodes ?
				 marked->subsector->flags & SSECF_DRAWN :
				 marked->Sector->MoreFlags & SECF_DRAWN)))
			{
				DrawMarker (tex, marked->X(), marked->Y(), 0, flip, mark->Scale.X, mark->Scale.Y, mark->Translation,
					mark->Alpha, mark->fillcolor, mark->RenderStyle);
			}
			marked = mark->args[0] != 0 ? it.Next() : NULL;
		}
	}
}